

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline_fp16s(InnerProduct_x86_avx512 *this,Option *opt)

{
  _func_int *p_Var1;
  size_t sVar2;
  int *piVar3;
  unsigned_short uVar4;
  uint _w;
  uint uVar5;
  Mat *this_00;
  long lVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  void *pvVar12;
  long lVar13;
  void *pvVar14;
  undefined1 (*pauVar15) [16];
  undefined1 (*pauVar16) [16];
  Mat *this_01;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  void *pvVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  unsigned_short *puVar32;
  long lVar33;
  long lVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  void *local_200;
  void *local_1f8;
  void *local_1f0;
  void *local_1e8;
  void *local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  ulong local_170;
  Mat local_168;
  ulong local_118;
  undefined8 local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  uint local_ec;
  Option *local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  void *local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  p_Var1 = this->_vptr_InnerProduct_x86_avx512[-3];
  uVar5 = *(uint *)(&this->field_0xd0 + (long)p_Var1);
  local_118 = (ulong)uVar5;
  _w = *(int *)(&this->field_0xd8 + (long)p_Var1) / (int)uVar5;
  bVar9 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar5 & 0xf) == 0) {
      bVar9 = 0x10;
    }
    else if ((uVar5 & 7) == 0) {
      bVar9 = 8;
    }
    else {
      bVar9 = ((uVar5 & 3) == 0) * '\x03' + 1;
    }
  }
  this_01 = (Mat *)(&this->field_0x130 + (long)p_Var1);
  this_00 = &this->weight_data_tm;
  local_e8 = opt;
  if (bVar9 < 8) {
    if (bVar9 == 1) {
      Mat::reshape(&local_168,this_01,_w,uVar5,(Allocator *)0x0);
      cast_float32_to_float16(&local_168,this_00,local_e8);
      if (local_168.refcount != (int *)0x0) {
        LOCK();
        *local_168.refcount = *local_168.refcount + -1;
        UNLOCK();
        if (*local_168.refcount == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            if (local_168.data != (void *)0x0) {
              free(local_168.data);
            }
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_002d8f5f;
    }
  }
  else {
    if (bVar9 != 8) {
      if (bVar9 == 0x10) {
        Mat::reshape(&local_168,this_01,_w,uVar5,(Allocator *)0x0);
        uVar10 = uVar5 + 0xf;
        if (-1 < (int)uVar5) {
          uVar10 = uVar5;
        }
        Mat::create(this_00,_w,(int)uVar10 >> 4,0x20,0x10,(Allocator *)0x0);
        if (0xf < (int)uVar5) {
          local_ec = _w & 0xfffffff0;
          lVar13 = 1;
          lVar28 = 2;
          lVar25 = 3;
          lVar26 = 4;
          lVar8 = 5;
          lVar34 = 6;
          lVar18 = 7;
          lVar33 = 8;
          lVar21 = 9;
          lVar23 = 10;
          local_b0 = 0xb;
          local_b8 = 0xc;
          local_c0 = 0xd;
          local_c8 = 0xe;
          local_d0 = 0xf;
          local_d8 = 0;
          local_170 = 0;
          do {
            lVar30 = (long)(this->weight_data_tm).w;
            pvVar12 = (this->weight_data_tm).data;
            sVar2 = (this->weight_data_tm).elemsize;
            lVar7 = (long)local_168.w;
            if ((int)_w < 0x10) {
              lVar27 = (local_170 >> 4) * lVar30 * sVar2;
              lVar7 = local_168.elemsize * lVar7;
              local_1d0 = (local_170 | 1) * lVar7;
              local_1d8 = (local_170 | 2) * lVar7;
              local_1c0 = (local_170 | 3) * lVar7;
              local_1b0 = (local_170 | 4) * lVar7;
              local_1c8 = (local_170 | 5) * lVar7;
              local_1b8 = (local_170 | 6) * lVar7;
              local_1a8 = (local_170 | 7) * lVar7;
              lVar24 = (local_170 | 8) * lVar7;
              local_190 = (local_170 | 9) * lVar7;
              lVar6 = (local_170 | 10) * lVar7;
              lVar31 = (local_170 | 0xb) * lVar7;
              local_198 = (local_170 | 0xc) * lVar7;
              lVar17 = (local_170 | 0xd) * lVar7;
              lVar19 = (local_170 | 0xe) * lVar7;
              lVar20 = lVar7 * (local_170 | 0xf);
              lVar30 = lVar7 * local_170;
              uVar5 = 0;
            }
            else {
              local_a0 = sVar2 * local_d8 * lVar30;
              local_e0 = local_168.elemsize * local_170 * lVar7;
              local_1d0 = local_168.elemsize * lVar13 * lVar7;
              local_1d8 = local_168.elemsize * lVar28 * lVar7;
              local_1c0 = local_168.elemsize * lVar25 * lVar7;
              local_1b0 = local_168.elemsize * lVar26 * lVar7;
              local_1c8 = local_168.elemsize * lVar8 * lVar7;
              local_1b8 = local_168.elemsize * lVar34 * lVar7;
              local_1a8 = local_168.elemsize * lVar18 * lVar7;
              lVar24 = local_168.elemsize * lVar33 * lVar7;
              local_190 = local_168.elemsize * lVar21 * lVar7;
              lVar6 = local_168.elemsize * lVar23 * lVar7;
              lVar31 = local_168.elemsize * local_b0 * lVar7;
              local_198 = local_168.elemsize * local_b8 * lVar7;
              lVar17 = local_168.elemsize * local_c0 * lVar7;
              lVar19 = local_168.elemsize * local_c8 * lVar7;
              lVar7 = local_168.elemsize * local_d0 * lVar7;
              local_f8 = (void *)((long)local_168.data + local_e0);
              local_100 = (void *)((long)local_168.data + local_1d0);
              local_108 = (void *)((long)local_168.data + local_1d8);
              local_110 = (void *)((long)local_168.data + local_1c0);
              local_38 = (void *)((long)local_168.data + local_1b0);
              local_40 = (void *)((long)local_168.data + local_1c8);
              local_48 = (void *)((long)local_168.data + local_1b8);
              local_98 = local_168.data;
              iVar11 = 0xf;
              lVar27 = 0;
              lVar20 = 0;
              do {
                auVar35 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8 + lVar20),3);
                auVar36 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_100 + lVar20),3);
                auVar37 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_108 + lVar20),3);
                auVar38 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_110 + lVar20),3);
                auVar39 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_38 + lVar20),3);
                auVar40 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_40 + lVar20),3);
                auVar41 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_48 + lVar20),3);
                auVar42 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_168.data + lVar20 + local_1a8),3);
                auVar43 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_168.data + lVar20 + lVar24),3);
                auVar44 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_168.data + lVar20 + local_190),3);
                auVar45 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_168.data + lVar20 + lVar6),3);
                auVar46 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_168.data + lVar20 + lVar31),3);
                auVar47 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_168.data + lVar20 + local_198),3);
                auVar48 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_168.data + lVar20 + lVar17),3);
                auVar49 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_168.data + lVar20 + lVar19),3);
                auVar50 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_168.data + lVar20 + lVar7),3);
                auVar51 = vpunpcklwd_avx512vl(auVar35,auVar36);
                auVar35 = vpunpckhwd_avx2(auVar35,auVar36);
                auVar55 = vpunpcklwd_avx2(auVar37,auVar38);
                auVar36 = vpunpckhwd_avx2(auVar37,auVar38);
                auVar56 = vpunpcklwd_avx2(auVar39,auVar40);
                auVar37 = vpunpckhwd_avx2(auVar39,auVar40);
                auVar57 = vpunpcklwd_avx2(auVar41,auVar42);
                auVar38 = vpunpckhwd_avx2(auVar41,auVar42);
                auVar68 = vpunpcklwd_avx2(auVar43,auVar44);
                auVar39 = vpunpckhwd_avx2(auVar43,auVar44);
                auVar43 = vpunpcklwd_avx2(auVar45,auVar46);
                auVar40 = vpunpckhwd_avx2(auVar45,auVar46);
                auVar44 = vpunpcklwd_avx2(auVar47,auVar48);
                auVar41 = vpunpckhwd_avx2(auVar47,auVar48);
                auVar45 = vpunpcklwd_avx2(auVar49,auVar50);
                auVar42 = vpunpckhwd_avx2(auVar49,auVar50);
                auVar46 = vpunpckldq_avx512vl(auVar51,auVar55);
                auVar47 = vpunpckhdq_avx512vl(auVar51,auVar55);
                auVar48 = vpunpckldq_avx512vl(auVar35,auVar36);
                auVar35 = vpunpckhdq_avx2(auVar35,auVar36);
                auVar55 = vpunpckldq_avx2(auVar56,auVar57);
                auVar36 = vpunpckhdq_avx2(auVar56,auVar57);
                auVar56 = vpunpckldq_avx2(auVar37,auVar38);
                auVar37 = vpunpckhdq_avx2(auVar37,auVar38);
                auVar57 = vpunpckldq_avx2(auVar68,auVar43);
                auVar38 = vpunpckhdq_avx2(auVar68,auVar43);
                auVar68 = vpunpckldq_avx2(auVar39,auVar40);
                auVar39 = vpunpckhdq_avx2(auVar39,auVar40);
                auVar43 = vpunpckldq_avx2(auVar44,auVar45);
                auVar40 = vpunpckhdq_avx2(auVar44,auVar45);
                auVar44 = vpunpckldq_avx2(auVar41,auVar42);
                auVar41 = vpunpckhdq_avx2(auVar41,auVar42);
                auVar45 = vpunpcklqdq_avx2(auVar46,auVar55);
                auVar42 = vpunpckhqdq_avx2(auVar46,auVar55);
                auVar55 = vpunpcklqdq_avx2(auVar47,auVar36);
                auVar36 = vpunpckhqdq_avx2(auVar47,auVar36);
                auVar46 = vpunpcklqdq_avx512vl(auVar48,auVar56);
                auVar47 = vpunpckhqdq_avx512vl(auVar48,auVar56);
                auVar48 = vpunpcklqdq_avx512vl(auVar35,auVar37);
                auVar35 = vpunpckhqdq_avx2(auVar35,auVar37);
                auVar56 = vpunpcklqdq_avx2(auVar57,auVar43);
                auVar37 = vpunpckhqdq_avx2(auVar57,auVar43);
                auVar57 = vpunpcklqdq_avx2(auVar38,auVar40);
                auVar38 = vpunpckhqdq_avx2(auVar38,auVar40);
                auVar43 = vpunpcklqdq_avx2(auVar68,auVar44);
                auVar40 = vpunpckhqdq_avx2(auVar68,auVar44);
                auVar68 = vpunpcklqdq_avx2(auVar39,auVar41);
                auVar39 = vpunpckhqdq_avx2(auVar39,auVar41);
                auVar72._0_16_ = ZEXT116(0) * auVar56._0_16_ + ZEXT116(1) * auVar45._0_16_;
                auVar72._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar56._0_16_;
                auVar44 = vinserti32x4_avx512vl(auVar42,auVar37._0_16_,1);
                auVar49 = vinserti32x4_avx512vl(auVar55,auVar57._0_16_,1);
                auVar50 = vinserti32x4_avx512vl(auVar36,auVar38._0_16_,1);
                auVar51 = vinserti32x4_avx512vl(auVar46,auVar43._0_16_,1);
                auVar52 = vinserti32x4_avx512vl(auVar47,auVar40._0_16_,1);
                auVar53 = vinserti32x4_avx512vl(auVar48,auVar68._0_16_,1);
                auVar54 = vinserti32x4_avx512vl(auVar35,auVar39._0_16_,1);
                auVar41 = vperm2i128_avx2(auVar45,auVar56,0x31);
                auVar37 = vperm2i128_avx2(auVar42,auVar37,0x31);
                auVar42 = vperm2i128_avx2(auVar55,auVar57,0x31);
                auVar36 = vperm2i128_avx2(auVar36,auVar38,0x31);
                auVar38 = vperm2i128_avx2(auVar46,auVar43,0x31);
                auVar40 = vperm2i128_avx2(auVar47,auVar40,0x31);
                auVar55 = vshufi64x2_avx512vl(auVar48,auVar68,3);
                auVar39 = vperm2i128_avx2(auVar35,auVar39,0x31);
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0) = auVar72;
                auVar35 = vmovdqu64_avx512vl(auVar44);
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0x20) = auVar35;
                auVar35 = vmovdqu64_avx512vl(auVar49);
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0x40) = auVar35;
                auVar35 = vmovdqu64_avx512vl(auVar50);
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0x60) = auVar35;
                auVar35 = vmovdqu64_avx512vl(auVar51);
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0x80) = auVar35;
                auVar35 = vmovdqu64_avx512vl(auVar52);
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0xa0) = auVar35;
                auVar35 = vmovdqu64_avx512vl(auVar53);
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0xc0) = auVar35;
                auVar35 = vmovdqu64_avx512vl(auVar54);
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0xe0) = auVar35;
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0x100) = auVar41;
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0x120) = auVar37;
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0x140) = auVar42;
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0x160) = auVar36;
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0x180) = auVar38;
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0x1a0) = auVar40;
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0x1c0) = auVar55;
                *(undefined1 (*) [32])((long)pvVar12 + lVar20 * 8 + local_a0 + 0x1e0) = auVar39;
                lVar20 = lVar20 + 0x40;
                lVar27 = lVar27 + 0x200;
                iVar11 = iVar11 + 0x10;
              } while (iVar11 < (int)_w);
              lVar27 = local_a0 + lVar27;
              lVar30 = local_e0 + lVar20;
              local_1d0 = local_1d0 + lVar20;
              local_1d8 = local_1d8 + lVar20;
              local_1c0 = local_1c0 + lVar20;
              local_1b0 = local_1b0 + lVar20;
              local_1c8 = local_1c8 + lVar20;
              local_1b8 = local_1b8 + lVar20;
              local_1a8 = local_1a8 + lVar20;
              lVar24 = lVar24 + lVar20;
              local_190 = local_190 + lVar20;
              lVar6 = lVar6 + lVar20;
              lVar31 = lVar31 + lVar20;
              local_198 = local_198 + lVar20;
              lVar17 = lVar17 + lVar20;
              lVar19 = lVar19 + lVar20;
              lVar20 = lVar7 + lVar20;
              uVar5 = local_ec;
            }
            lVar27 = (long)pvVar12 + lVar27;
            local_198 = (long)local_168.data + local_198;
            local_1b0 = (long)local_168.data + local_1b0;
            local_1b8 = (long)local_168.data + local_1b8;
            local_1c0 = (long)local_168.data + local_1c0;
            local_1c8 = (long)local_168.data + local_1c8;
            local_1d8 = (long)local_168.data + local_1d8;
            local_1f0 = (void *)((long)local_168.data + lVar17);
            local_1e0 = (void *)((long)local_168.data + lVar6);
            lVar20 = (long)local_168.data + lVar20;
            local_190 = (long)local_168.data + local_190;
            local_1a8 = (long)local_168.data + local_1a8;
            local_1d0 = (long)local_168.data + local_1d0;
            lVar30 = (long)local_168.data + lVar30;
            local_1f8 = (void *)((long)local_168.data + lVar19);
            local_1e8 = (void *)((long)local_168.data + lVar31);
            local_200 = (void *)((long)local_168.data + lVar24);
            if ((int)(uVar5 | 7) < (int)_w) {
              lVar24 = 0;
              lVar7 = 0;
              uVar10 = uVar5;
              do {
                auVar58 = vcvtps2ph_f16c(*(undefined1 (*) [32])(lVar30 + lVar7),3);
                auVar59 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1d0 + lVar7),3);
                auVar60 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1d8 + lVar7),3);
                auVar61 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1c0 + lVar7),3);
                auVar62 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1b0 + lVar7),3);
                auVar63 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1c8 + lVar7),3);
                auVar64 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1b8 + lVar7),3);
                auVar65 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1a8 + lVar7),3);
                auVar66 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_200 + lVar7),3);
                auVar67 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_190 + lVar7),3);
                auVar69 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e0 + lVar7),3);
                auVar70 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e8 + lVar7),3);
                auVar71 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_198 + lVar7),3);
                auVar73 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1f0 + lVar7),3);
                auVar74 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1f8 + lVar7),3);
                auVar75 = vcvtps2ph_f16c(*(undefined1 (*) [32])(lVar20 + lVar7),3);
                auVar35._0_16_ = ZEXT116(0) * auVar66 + ZEXT116(1) * auVar58;
                auVar35._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar66;
                auVar36._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar59;
                auVar36._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
                auVar37._0_16_ = ZEXT116(0) * auVar69 + ZEXT116(1) * auVar60;
                auVar37._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar69;
                auVar38._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar61;
                auVar38._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar70;
                auVar42._0_16_ = ZEXT116(0) * auVar71 + ZEXT116(1) * auVar62;
                auVar42._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar71;
                auVar55._0_16_ = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar63;
                auVar55._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar73;
                auVar56._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar64;
                auVar56._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74;
                auVar57._0_16_ = ZEXT116(0) * auVar75 + ZEXT116(1) * auVar65;
                auVar57._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar75;
                auVar39 = vpunpcklwd_avx2(auVar35,auVar36);
                auVar35 = vpunpckhwd_avx2(auVar35,auVar36);
                auVar40 = vpunpcklwd_avx2(auVar37,auVar38);
                auVar36 = vpunpckhwd_avx2(auVar37,auVar38);
                auVar41 = vpunpcklwd_avx2(auVar42,auVar55);
                auVar37 = vpunpckhwd_avx2(auVar42,auVar55);
                auVar42 = vpunpcklwd_avx2(auVar56,auVar57);
                auVar38 = vpunpckhwd_avx2(auVar56,auVar57);
                auVar55 = vpunpckldq_avx2(auVar39,auVar40);
                auVar39 = vpunpckhdq_avx2(auVar39,auVar40);
                auVar40 = vpunpckldq_avx2(auVar35,auVar36);
                auVar35 = vpunpckhdq_avx2(auVar35,auVar36);
                auVar56 = vpunpckldq_avx2(auVar41,auVar42);
                auVar36 = vpunpckhdq_avx2(auVar41,auVar42);
                auVar41 = vpunpckldq_avx2(auVar37,auVar38);
                auVar37 = vpunpckhdq_avx2(auVar37,auVar38);
                auVar42 = vpunpcklqdq_avx2(auVar55,auVar56);
                auVar38 = vpunpckhqdq_avx2(auVar55,auVar56);
                auVar55 = vpunpcklqdq_avx2(auVar39,auVar36);
                auVar36 = vpunpckhqdq_avx2(auVar39,auVar36);
                auVar56 = vpunpcklqdq_avx2(auVar40,auVar41);
                auVar39 = vpunpckhqdq_avx2(auVar40,auVar41);
                auVar40 = vpunpcklqdq_avx2(auVar35,auVar37);
                auVar35 = vpunpckhqdq_avx2(auVar35,auVar37);
                *(undefined1 (*) [32])(lVar27 + lVar7 * 8) = auVar42;
                *(undefined1 (*) [32])(lVar27 + lVar7 * 8 + 0x20) = auVar38;
                *(undefined1 (*) [32])(lVar27 + lVar7 * 8 + 0x40) = auVar55;
                *(undefined1 (*) [32])(lVar27 + lVar7 * 8 + 0x60) = auVar36;
                *(undefined1 (*) [32])(lVar27 + lVar7 * 8 + 0x80) = auVar56;
                *(undefined1 (*) [32])(lVar27 + lVar7 * 8 + 0xa0) = auVar39;
                *(undefined1 (*) [32])(lVar27 + lVar7 * 8 + 0xc0) = auVar40;
                *(undefined1 (*) [32])(lVar27 + lVar7 * 8 + 0xe0) = auVar35;
                uVar5 = uVar10 + 8;
                lVar7 = lVar7 + 0x20;
                lVar24 = lVar24 + 0x100;
                iVar11 = uVar10 + 0xf;
                uVar10 = uVar5;
              } while (iVar11 < (int)_w);
              lVar27 = lVar27 + lVar24;
              lVar30 = lVar30 + lVar7;
              local_1d0 = local_1d0 + lVar7;
              local_1d8 = local_1d8 + lVar7;
              local_1c0 = local_1c0 + lVar7;
              local_1b0 = local_1b0 + lVar7;
              local_1c8 = local_1c8 + lVar7;
              local_1b8 = local_1b8 + lVar7;
              local_1a8 = local_1a8 + lVar7;
              local_200 = (void *)((long)local_200 + lVar7);
              local_190 = local_190 + lVar7;
              local_1e0 = (void *)((long)local_1e0 + lVar7);
              local_1e8 = (void *)((long)local_1e8 + lVar7);
              local_198 = local_198 + lVar7;
              local_1f0 = (void *)((long)local_1f0 + lVar7);
              local_1f8 = (void *)((long)local_1f8 + lVar7);
              lVar20 = lVar20 + lVar7;
            }
            iVar11 = _w - uVar5;
            local_a8 = lVar13;
            local_90 = lVar23;
            local_88 = lVar21;
            local_80 = lVar33;
            local_78 = lVar18;
            local_70 = lVar34;
            local_68 = lVar8;
            local_60 = lVar26;
            local_58 = lVar25;
            local_50 = lVar28;
            if (iVar11 != 0 && (int)uVar5 <= (int)_w) {
              lVar13 = 0;
              do {
                uVar4 = float32_to_float16(*(float *)(lVar30 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8) = uVar4;
                uVar4 = float32_to_float16(*(float *)(local_1d0 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 2) = uVar4;
                uVar4 = float32_to_float16(*(float *)(local_1d8 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 4) = uVar4;
                uVar4 = float32_to_float16(*(float *)(local_1c0 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 6) = uVar4;
                uVar4 = float32_to_float16(*(float *)(local_1b0 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 8) = uVar4;
                uVar4 = float32_to_float16(*(float *)(local_1c8 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 10) = uVar4;
                uVar4 = float32_to_float16(*(float *)(local_1b8 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 0xc) = uVar4;
                uVar4 = float32_to_float16(*(float *)(local_1a8 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 0xe) = uVar4;
                uVar4 = float32_to_float16(*(float *)((long)local_200 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x10) = uVar4;
                uVar4 = float32_to_float16(*(float *)(local_190 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x12) = uVar4;
                uVar4 = float32_to_float16(*(float *)((long)local_1e0 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x14) = uVar4;
                uVar4 = float32_to_float16(*(float *)((long)local_1e8 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x16) = uVar4;
                uVar4 = float32_to_float16(*(float *)(local_198 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x18) = uVar4;
                uVar4 = float32_to_float16(*(float *)((long)local_1f0 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x1a) = uVar4;
                uVar4 = float32_to_float16(*(float *)((long)local_1f8 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x1c) = uVar4;
                uVar4 = float32_to_float16(*(float *)(lVar20 + lVar13));
                *(unsigned_short *)(lVar27 + lVar13 * 8 + 0x1e) = uVar4;
                lVar13 = lVar13 + 4;
                iVar11 = iVar11 + -1;
              } while (iVar11 != 0);
            }
            local_170 = local_170 + 0x10;
            local_d8 = local_d8 + 1;
            lVar13 = local_a8 + 0x10;
            lVar28 = local_50 + 0x10;
            lVar25 = local_58 + 0x10;
            lVar26 = local_60 + 0x10;
            lVar8 = local_68 + 0x10;
            lVar34 = local_70 + 0x10;
            lVar18 = local_78 + 0x10;
            lVar33 = local_80 + 0x10;
            lVar21 = local_88 + 0x10;
            lVar23 = local_90 + 0x10;
            local_b0 = local_b0 + 0x10;
            local_b8 = local_b8 + 0x10;
            local_c0 = local_c0 + 0x10;
            local_c8 = local_c8 + 0x10;
            local_d0 = local_d0 + 0x10;
          } while ((int)((uint)local_170 | 0xf) < (int)local_118);
        }
        if (local_168.refcount != (int *)0x0) {
          LOCK();
          *local_168.refcount = *local_168.refcount + -1;
          UNLOCK();
          if (*local_168.refcount == 0) {
            if (local_168.allocator == (Allocator *)0x0) {
              if (local_168.data != (void *)0x0) {
                free(local_168.data);
              }
            }
            else {
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      goto LAB_002d8f5f;
    }
    Mat::reshape(&local_168,this_01,_w,uVar5,(Allocator *)0x0);
    uVar10 = uVar5 + 7;
    if (-1 < (int)uVar5) {
      uVar10 = uVar5;
    }
    Mat::create(this_00,_w,(int)uVar10 >> 3,0x10,8,(Allocator *)0x0);
    if (7 < (int)uVar5) {
      local_110 = (void *)(CONCAT44(local_110._4_4_,_w) & 0xfffffffffffffff0);
      lVar21 = 1;
      lVar13 = 2;
      lVar23 = 3;
      lVar25 = 4;
      lVar26 = 5;
      local_1a0 = 6;
      local_1a8 = 7;
      lVar18 = 0;
      uVar29 = 0;
      do {
        lVar34 = (long)(this->weight_data_tm).w;
        pvVar12 = (this->weight_data_tm).data;
        sVar2 = (this->weight_data_tm).elemsize;
        lVar8 = (long)local_168.w;
        if ((int)_w < 0x10) {
          puVar32 = (unsigned_short *)((long)pvVar12 + (uVar29 >> 3) * lVar34 * sVar2);
          lVar8 = local_168.elemsize * lVar8;
          pvVar22 = (void *)(lVar8 * uVar29 + (long)local_168.data);
          local_200 = (void *)((uVar29 | 1) * lVar8 + (long)local_168.data);
          local_1e0 = (void *)((uVar29 | 2) * lVar8 + (long)local_168.data);
          local_1e8 = (void *)((uVar29 | 3) * lVar8 + (long)local_168.data);
          local_1f0 = (void *)((uVar29 | 4) * lVar8 + (long)local_168.data);
          local_1f8 = (void *)((uVar29 | 5) * lVar8 + (long)local_168.data);
          pvVar14 = (void *)((uVar29 | 6) * lVar8 + (long)local_168.data);
          pvVar12 = (void *)(lVar8 * (uVar29 | 7) + (long)local_168.data);
          uVar5 = 0;
        }
        else {
          local_108 = (void *)(sVar2 * lVar18 * lVar34);
          local_f8 = (void *)(local_168.elemsize * uVar29 * lVar8);
          lVar24 = local_168.elemsize * lVar21 * lVar8;
          lVar6 = local_168.elemsize * lVar13 * lVar8;
          lVar33 = local_168.elemsize * lVar23 * lVar8;
          lVar28 = local_168.elemsize * lVar25 * lVar8;
          lVar7 = local_168.elemsize * lVar26 * lVar8;
          lVar30 = local_168.elemsize * local_1a0 * lVar8;
          lVar8 = local_168.elemsize * local_1a8 * lVar8;
          local_100 = local_168.data;
          iVar11 = 0xf;
          lVar31 = 0;
          lVar34 = 0;
          do {
            auVar35 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)((long)local_f8 + (long)local_168.data) + lVar34),3)
            ;
            auVar36 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_168.data + lVar34 + lVar24),3);
            auVar37 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_168.data + lVar34 + lVar6),3);
            auVar38 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_168.data + lVar34 + lVar33),3);
            auVar42 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_168.data + lVar34 + lVar28),3);
            auVar55 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_168.data + lVar34 + lVar7),3);
            auVar56 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_168.data + lVar34 + lVar30),3);
            auVar57 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_168.data + lVar34 + lVar8),3);
            auVar39 = vpunpcklwd_avx2(auVar35,auVar36);
            auVar35 = vpunpckhwd_avx2(auVar35,auVar36);
            auVar40 = vpunpcklwd_avx2(auVar37,auVar38);
            auVar36 = vpunpckhwd_avx2(auVar37,auVar38);
            auVar41 = vpunpcklwd_avx2(auVar42,auVar55);
            auVar37 = vpunpckhwd_avx2(auVar42,auVar55);
            auVar42 = vpunpcklwd_avx2(auVar56,auVar57);
            auVar38 = vpunpckhwd_avx2(auVar56,auVar57);
            auVar55 = vpunpckldq_avx2(auVar39,auVar40);
            auVar39 = vpunpckhdq_avx2(auVar39,auVar40);
            auVar40 = vpunpckldq_avx2(auVar35,auVar36);
            auVar35 = vpunpckhdq_avx2(auVar35,auVar36);
            auVar56 = vpunpckldq_avx2(auVar41,auVar42);
            auVar36 = vpunpckhdq_avx2(auVar41,auVar42);
            auVar41 = vpunpckldq_avx2(auVar37,auVar38);
            auVar37 = vpunpckhdq_avx2(auVar37,auVar38);
            auVar42 = vpunpcklqdq_avx2(auVar55,auVar56);
            auVar38 = vpunpckhqdq_avx2(auVar55,auVar56);
            auVar55 = vpunpcklqdq_avx2(auVar39,auVar36);
            auVar36 = vpunpckhqdq_avx2(auVar39,auVar36);
            auVar56 = vpunpcklqdq_avx2(auVar40,auVar41);
            auVar39 = vpunpckhqdq_avx2(auVar40,auVar41);
            auVar40 = vpunpcklqdq_avx2(auVar35,auVar37);
            auVar35 = vpunpckhqdq_avx2(auVar35,auVar37);
            auVar41._0_16_ = ZEXT116(0) * auVar38._0_16_ + ZEXT116(1) * auVar42._0_16_;
            auVar41._16_16_ = ZEXT116(0) * auVar42._16_16_ + ZEXT116(1) * auVar38._0_16_;
            auVar68._0_16_ = ZEXT116(0) * auVar36._0_16_ + ZEXT116(1) * auVar55._0_16_;
            auVar68._16_16_ = ZEXT116(0) * auVar55._16_16_ + ZEXT116(1) * auVar36._0_16_;
            auVar43._0_16_ = ZEXT116(0) * auVar39._0_16_ + ZEXT116(1) * auVar56._0_16_;
            auVar43._16_16_ = ZEXT116(0) * auVar56._16_16_ + ZEXT116(1) * auVar39._0_16_;
            auVar44._0_16_ = ZEXT116(0) * auVar35._0_16_ + ZEXT116(1) * auVar40._0_16_;
            auVar44._16_16_ = ZEXT116(0) * auVar40._16_16_ + ZEXT116(1) * auVar35._0_16_;
            auVar37 = vperm2i128_avx2(auVar42,auVar38,0x31);
            auVar36 = vperm2i128_avx2(auVar55,auVar36,0x31);
            auVar38 = vperm2i128_avx2(auVar56,auVar39,0x31);
            auVar35 = vperm2i128_avx2(auVar40,auVar35,0x31);
            *(undefined1 (*) [32])((long)local_108 + (long)(lVar34 * 4 + (long)pvVar12)) = auVar41;
            *(undefined1 (*) [32])((long)local_108 + (long)pvVar12 + lVar34 * 4 + 0x20) = auVar68;
            *(undefined1 (*) [32])((long)local_108 + (long)pvVar12 + lVar34 * 4 + 0x40) = auVar43;
            *(undefined1 (*) [32])((long)local_108 + (long)pvVar12 + lVar34 * 4 + 0x60) = auVar44;
            *(undefined1 (*) [32])((long)local_108 + (long)pvVar12 + lVar34 * 4 + 0x80) = auVar37;
            *(undefined1 (*) [32])((long)local_108 + (long)pvVar12 + lVar34 * 4 + 0xa0) = auVar36;
            *(undefined1 (*) [32])((long)local_108 + (long)pvVar12 + lVar34 * 4 + 0xc0) = auVar38;
            *(undefined1 (*) [32])((long)local_108 + (long)pvVar12 + lVar34 * 4 + 0xe0) = auVar35;
            lVar34 = lVar34 + 0x40;
            lVar31 = lVar31 + 0x100;
            iVar11 = iVar11 + 0x10;
          } while (iVar11 < (int)_w);
          puVar32 = (unsigned_short *)((long)pvVar12 + lVar31 + (long)local_108);
          lVar34 = (long)local_168.data + lVar34;
          pvVar22 = (void *)((long)local_f8 + lVar34);
          local_200 = (void *)(lVar24 + lVar34);
          local_1e0 = (void *)(lVar6 + lVar34);
          local_1e8 = (void *)(lVar33 + lVar34);
          local_1f0 = (void *)(lVar28 + lVar34);
          local_1f8 = (void *)(lVar7 + lVar34);
          pvVar14 = (void *)(lVar30 + lVar34);
          pvVar12 = (void *)(lVar8 + lVar34);
          uVar5 = (uint)local_110;
        }
        if ((int)(uVar5 | 7) < (int)_w) {
          lVar34 = 0;
          lVar8 = 0;
          uVar10 = uVar5;
          do {
            auVar58 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)pvVar22 + lVar8),3);
            auVar59 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_200 + lVar8),3);
            auVar60 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e0 + lVar8),3);
            auVar61 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e8 + lVar8),3);
            auVar65 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1f0 + lVar8),3);
            auVar66 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1f8 + lVar8),3);
            auVar67 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)pvVar14 + lVar8),3);
            auVar69 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)pvVar12 + lVar8),3);
            auVar62 = vpunpcklwd_avx(auVar58,auVar59);
            auVar58 = vpunpckhwd_avx(auVar58,auVar59);
            auVar63 = vpunpcklwd_avx(auVar60,auVar61);
            auVar59 = vpunpckhwd_avx(auVar60,auVar61);
            auVar64 = vpunpcklwd_avx(auVar65,auVar66);
            auVar60 = vpunpckhwd_avx(auVar65,auVar66);
            auVar65 = vpunpcklwd_avx(auVar67,auVar69);
            auVar61 = vpunpckhwd_avx(auVar67,auVar69);
            auVar66 = vpunpckldq_avx(auVar62,auVar63);
            auVar62 = vpunpckhdq_avx(auVar62,auVar63);
            auVar63 = vpunpckldq_avx(auVar58,auVar59);
            auVar58 = vpunpckhdq_avx(auVar58,auVar59);
            auVar67 = vpunpckldq_avx(auVar64,auVar65);
            auVar59 = vpunpckhdq_avx(auVar64,auVar65);
            auVar64 = vpunpckldq_avx(auVar60,auVar61);
            auVar60 = vpunpckhdq_avx(auVar60,auVar61);
            auVar65 = vpunpcklqdq_avx(auVar66,auVar67);
            auVar61 = vpunpckhqdq_avx(auVar66,auVar67);
            auVar66 = vpunpcklqdq_avx(auVar62,auVar59);
            auVar59 = vpunpckhqdq_avx(auVar62,auVar59);
            auVar67 = vpunpcklqdq_avx(auVar63,auVar64);
            auVar62 = vpunpckhqdq_avx(auVar63,auVar64);
            auVar63 = vpunpcklqdq_avx(auVar58,auVar60);
            auVar58 = vpunpckhqdq_avx(auVar58,auVar60);
            *(undefined1 (*) [16])(puVar32 + lVar8 * 2) = auVar65;
            *(undefined1 (*) [16])(puVar32 + lVar8 * 2 + 8) = auVar61;
            *(undefined1 (*) [16])(puVar32 + lVar8 * 2 + 0x10) = auVar66;
            *(undefined1 (*) [16])(puVar32 + lVar8 * 2 + 0x18) = auVar59;
            *(undefined1 (*) [16])(puVar32 + lVar8 * 2 + 0x20) = auVar67;
            *(undefined1 (*) [16])(puVar32 + lVar8 * 2 + 0x28) = auVar62;
            *(undefined1 (*) [16])(puVar32 + lVar8 * 2 + 0x30) = auVar63;
            *(undefined1 (*) [16])(puVar32 + lVar8 * 2 + 0x38) = auVar58;
            uVar5 = uVar10 + 8;
            lVar8 = lVar8 + 0x20;
            lVar34 = lVar34 + 0x80;
            iVar11 = uVar10 + 0xf;
            uVar10 = uVar5;
          } while (iVar11 < (int)_w);
          puVar32 = (unsigned_short *)((long)puVar32 + lVar34);
          pvVar22 = (void *)((long)pvVar22 + lVar8);
          local_200 = (void *)((long)local_200 + lVar8);
          local_1e0 = (void *)((long)local_1e0 + lVar8);
          local_1e8 = (void *)((long)local_1e8 + lVar8);
          local_1f0 = (void *)((long)local_1f0 + lVar8);
          local_1f8 = (void *)((long)local_1f8 + lVar8);
          pvVar14 = (void *)((long)pvVar14 + lVar8);
          pvVar12 = (void *)((long)pvVar12 + lVar8);
        }
        if ((int)uVar5 < (int)_w) {
          lVar8 = 0;
          do {
            uVar4 = float32_to_float16(*(float *)((long)pvVar22 + lVar8 * 4));
            *puVar32 = uVar4;
            uVar4 = float32_to_float16(*(float *)((long)local_200 + lVar8 * 4));
            puVar32[1] = uVar4;
            uVar4 = float32_to_float16(*(float *)((long)local_1e0 + lVar8 * 4));
            puVar32[2] = uVar4;
            uVar4 = float32_to_float16(*(float *)((long)local_1e8 + lVar8 * 4));
            puVar32[3] = uVar4;
            uVar4 = float32_to_float16(*(float *)((long)local_1f0 + lVar8 * 4));
            puVar32[4] = uVar4;
            uVar4 = float32_to_float16(*(float *)((long)local_1f8 + lVar8 * 4));
            puVar32[5] = uVar4;
            uVar4 = float32_to_float16(*(float *)((long)pvVar14 + lVar8 * 4));
            puVar32[6] = uVar4;
            uVar4 = float32_to_float16(*(float *)((long)pvVar12 + lVar8 * 4));
            puVar32[7] = uVar4;
            puVar32 = puVar32 + 8;
            lVar8 = lVar8 + 1;
          } while (_w - uVar5 != (int)lVar8);
        }
        uVar29 = uVar29 + 8;
        lVar18 = lVar18 + 1;
        lVar21 = lVar21 + 8;
        lVar13 = lVar13 + 8;
        lVar23 = lVar23 + 8;
        lVar25 = lVar25 + 8;
        lVar26 = lVar26 + 8;
        local_1a0 = local_1a0 + 8;
        local_1a8 = local_1a8 + 8;
        uVar5 = (uint)local_118;
      } while ((int)((uint)uVar29 | 7) < (int)uVar5);
    }
    if (local_168.refcount != (int *)0x0) {
      LOCK();
      *local_168.refcount = *local_168.refcount + -1;
      UNLOCK();
      if (*local_168.refcount == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (bVar9 == 4) {
    Mat::reshape(&local_168,this_01,_w,uVar5,(Allocator *)0x0);
    uVar10 = uVar5 + 3;
    if (-1 < (int)uVar5) {
      uVar10 = uVar5;
    }
    Mat::create(this_00,_w,(int)uVar10 >> 2,8,4,(Allocator *)0x0);
    if (3 < (int)uVar5) {
      local_1d8._0_4_ = _w & 0xfffffffc;
      lVar18 = 3;
      lVar21 = 2;
      lVar23 = 1;
      lVar13 = 0;
      uVar29 = 0;
      do {
        pvVar14 = local_168.data;
        lVar26 = (long)(this->weight_data_tm).w;
        pvVar12 = (this->weight_data_tm).data;
        sVar2 = (this->weight_data_tm).elemsize;
        pauVar15 = (undefined1 (*) [16])((uVar29 >> 2) * lVar26 * sVar2 + (long)pvVar12);
        lVar25 = (long)local_168.w;
        if ((int)_w < 4) {
          lVar25 = local_168.elemsize * lVar25;
          lVar28 = lVar25 * uVar29;
          lVar33 = (uVar29 | 1) * lVar25;
          lVar34 = (uVar29 | 2) * lVar25;
          lVar8 = lVar25 * (uVar29 | 3);
          uVar5 = 0;
        }
        else {
          lVar8 = local_168.elemsize * lVar18 * lVar25;
          lVar34 = local_168.elemsize * lVar21 * lVar25;
          lVar33 = local_168.elemsize * lVar23 * lVar25;
          lVar25 = local_168.elemsize * uVar29 * lVar25;
          iVar11 = 3;
          lVar28 = 0;
          do {
            pauVar16 = pauVar15;
            auVar58 = *(undefined1 (*) [16])((long)local_168.data + lVar28 + lVar25);
            auVar59 = *(undefined1 (*) [16])((long)local_168.data + lVar28 + lVar33);
            auVar60 = *(undefined1 (*) [16])((long)local_168.data + lVar28 + lVar34);
            auVar61 = *(undefined1 (*) [16])((long)local_168.data + lVar28 + lVar8);
            auVar62 = vpunpckldq_avx(auVar58,auVar59);
            auVar63 = vpunpckldq_avx(auVar60,auVar61);
            auVar58 = vpunpckhdq_avx(auVar58,auVar59);
            auVar59 = vpunpckhdq_avx(auVar60,auVar61);
            auVar61 = vpunpcklqdq_avx(auVar62,auVar63);
            auVar60 = vpunpckhqdq_avx(auVar62,auVar63);
            auVar62 = vpunpcklqdq_avx(auVar58,auVar59);
            auVar58 = vpunpckhqdq_avx(auVar58,auVar59);
            auVar40._0_16_ = ZEXT116(0) * auVar60 + ZEXT116(1) * auVar61;
            auVar40._16_16_ = ZEXT116(1) * auVar60;
            auVar39._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar62;
            auVar39._16_16_ = ZEXT116(1) * auVar58;
            pauVar15 = (undefined1 (*) [16])((long)pvVar12 + lVar28 * 2 + sVar2 * lVar13 * lVar26);
            auVar58 = vcvtps2ph_f16c(auVar40,3);
            *pauVar15 = auVar58;
            auVar58 = vcvtps2ph_f16c(auVar39,3);
            pauVar15[1] = auVar58;
            iVar11 = iVar11 + 4;
            lVar28 = lVar28 + 0x10;
            pauVar15 = pauVar15 + 2;
          } while (iVar11 < (int)_w);
          pauVar15 = pauVar16 + 2;
          lVar8 = lVar8 + lVar28;
          lVar34 = lVar34 + lVar28;
          lVar33 = lVar33 + lVar28;
          lVar28 = lVar25 + lVar28;
          uVar5 = (uint)local_1d8;
        }
        if ((int)uVar5 < (int)_w) {
          lVar25 = 0;
          do {
            uVar4 = float32_to_float16(*(float *)((long)pvVar14 + lVar25 * 4 + lVar28));
            *(unsigned_short *)(*pauVar15 + lVar25 * 8) = uVar4;
            uVar4 = float32_to_float16(*(float *)((long)pvVar14 + lVar25 * 4 + lVar33));
            *(unsigned_short *)(*pauVar15 + lVar25 * 8 + 2) = uVar4;
            uVar4 = float32_to_float16(*(float *)((long)pvVar14 + lVar25 * 4 + lVar34));
            *(unsigned_short *)(*pauVar15 + lVar25 * 8 + 4) = uVar4;
            uVar4 = float32_to_float16(*(float *)((long)pvVar14 + lVar25 * 4 + lVar8));
            *(unsigned_short *)(*pauVar15 + lVar25 * 8 + 6) = uVar4;
            lVar25 = lVar25 + 1;
          } while (_w - uVar5 != (int)lVar25);
        }
        uVar29 = uVar29 + 4;
        lVar18 = lVar18 + 4;
        lVar21 = lVar21 + 4;
        lVar23 = lVar23 + 4;
        lVar13 = lVar13 + 1;
      } while ((int)((uint)uVar29 | 3) < (int)local_118);
    }
    if (local_168.refcount != (int *)0x0) {
      LOCK();
      *local_168.refcount = *local_168.refcount + -1;
      UNLOCK();
      if (*local_168.refcount == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
LAB_002d8f5f:
  if (local_e8->lightmode == true) {
    p_Var1 = this->_vptr_InnerProduct_x86_avx512[-3];
    piVar3 = *(int **)(&this->field_0x138 + (long)p_Var1);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var1) == (long *)0x0) {
          if (*(void **)(&this->field_0x130 + (long)p_Var1) != (void *)0x0) {
            free(*(void **)(&this->field_0x130 + (long)p_Var1));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var1) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var1) = 0;
    *(undefined1 (*) [16])(&this->field_0x13c + (long)p_Var1) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(&this->field_0x130 + (long)p_Var1) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(&this->field_0x158 + (long)p_Var1) = (undefined1  [16])0x0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var1) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}